

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive-solver.hpp
# Opt level: O1

int __thiscall
baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
          (exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *this,int k,
          unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
          *reduced_cost,int r_size)

{
  exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *peVar1;
  rc_data *prVar2;
  item *piVar3;
  uint uVar4;
  ulong uVar5;
  __normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item_*,_std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>_>
  _Var6;
  exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *peVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  size_type __new_size;
  exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *peVar15;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  
  peVar1 = this + 0x50;
  peVar7 = peVar1;
  for (peVar15 = *(exhaustive_solver<baryonyx::itm::minimize_tag,long_double> **)(this + 0x58);
      peVar15 != (exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)0x0;
      peVar15 = *(exhaustive_solver<baryonyx::itm::minimize_tag,long_double> **)
                 (peVar15 + (ulong)(*(int *)(peVar15 + 0x20) < k) * 8 + 0x10)) {
    if (k <= *(int *)(peVar15 + 0x20)) {
      peVar7 = peVar15;
    }
  }
  peVar15 = peVar1;
  if ((peVar7 != peVar1) && (peVar15 = peVar7, k < *(int *)(peVar7 + 0x20))) {
    peVar15 = peVar1;
  }
  if (peVar15 != peVar1) {
    __new_size = (size_type)r_size;
    std::
    vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
    ::resize((vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item,_std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,_long_double>::item>_>
              *)this,__new_size);
    uVar5 = (ulong)(uint)r_size;
    if (r_size != 0) {
      prVar2 = (reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      lVar8 = *(long *)this;
      lVar12 = 0;
      do {
        *(unkbyte10 *)(lVar8 + lVar12) = *(unkbyte10 *)((long)&prVar2->value + lVar12);
        *(undefined4 *)(lVar8 + 0x14 + lVar12) = *(undefined4 *)((long)&prVar2->id + lVar12);
        *(undefined4 *)(lVar8 + 0x10 + lVar12) = *(undefined4 *)((long)&prVar2->f + lVar12);
        *(undefined4 *)(lVar8 + 0x18 + lVar12) = 0;
        lVar12 = lVar12 + 0x20;
      } while (uVar5 << 5 != lVar12);
    }
    lVar8 = (long)*(int *)(peVar15 + 0x24);
    lVar17 = (longdouble)0;
    if (r_size != 0) {
      lVar17 = (longdouble)0;
      lVar12 = 0;
      do {
        if (*(int *)(lVar8 * 4 + *(long *)(this + 0x18) + lVar12) != 0) {
          lVar17 = *(longdouble *)
                    ((long)&((reduced_cost->_M_t).
                             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                             .
                             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                            ._M_head_impl)->value + lVar12 * 8) + lVar17;
        }
        lVar12 = lVar12 + 4;
      } while (uVar5 * 4 - lVar12 != 0);
    }
    iVar9 = 0;
    if ((ulong)*(uint *)(peVar15 + 0x28) != 1) {
      lVar12 = lVar8 * 4 + __new_size * 4 + *(long *)(this + 0x18);
      uVar10 = 0;
      uVar13 = 1;
      do {
        lVar18 = (longdouble)0;
        if (r_size != 0) {
          lVar14 = 0;
          do {
            if (*(int *)(lVar12 + lVar14) != 0) {
              lVar18 = *(longdouble *)
                        ((long)&((reduced_cost->_M_t).
                                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
                                ._M_head_impl)->value + lVar14 * 8) + lVar18;
            }
            lVar14 = lVar14 + 4;
          } while (uVar5 * 4 - lVar14 != 0);
        }
        lVar16 = lVar17;
        if (lVar18 <= lVar17 || lVar17 != lVar18) {
          lVar16 = lVar18;
        }
        if (lVar18 < lVar17) {
          uVar10 = uVar13 & 0xffffffff;
        }
        iVar9 = (int)uVar10;
        uVar13 = uVar13 + 1;
        lVar12 = lVar12 + __new_size * 4;
        lVar17 = lVar16;
      } while (uVar13 != *(uint *)(peVar15 + 0x28));
    }
    if (r_size != 0) {
      lVar12 = *(long *)this;
      lVar14 = *(long *)(this + 0x18);
      lVar11 = 0;
      do {
        *(uint *)(lVar12 + 0x18 + lVar11 * 8) =
             (uint)(*(int *)((iVar9 * r_size + lVar8) * 4 + lVar14 + lVar11) != 0);
        lVar11 = lVar11 + 4;
      } while (uVar5 << 2 != lVar11);
    }
    lVar8 = *(long *)this;
    lVar12 = *(long *)(this + 8);
    if (lVar8 != lVar12) {
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar8,lVar12,(int)LZCOUNT(lVar12 - lVar8 >> 5) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                (lVar8,lVar12);
    }
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item*,std::vector<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item,std::allocator<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::item>>>,__gnu_cxx::__ops::_Iter_pred<baryonyx::itm::exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>(int,std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>&,int)::_lambda(auto:1_const&)_1_>>
                      (*(undefined8 *)this,*(undefined8 *)(this + 8));
    lVar8 = *(long *)this;
    piVar3 = *(item **)(this + 8);
    lVar12 = (long)piVar3 - lVar8;
    if (lVar12 != 0) {
      lVar12 = lVar12 >> 5;
      prVar2 = (reduced_cost->_M_t).
               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               ._M_t.
               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data[]>_>
               .
               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>::rc_data_*,_false>
               ._M_head_impl;
      lVar14 = 0x14;
      do {
        *(unkbyte10 *)((long)prVar2 + lVar14 + -0x14) = *(unkbyte10 *)(lVar8 + -0x14 + lVar14);
        *(undefined4 *)((long)prVar2 + lVar14 + -4) = *(undefined4 *)(lVar8 + lVar14);
        *(undefined4 *)((long)&prVar2->value + lVar14) = *(undefined4 *)(lVar8 + -4 + lVar14);
        lVar14 = lVar14 + 0x20;
        lVar12 = lVar12 + -1;
      } while (lVar12 != 0);
    }
    if (_Var6._M_current == piVar3) {
      uVar4 = -(uint)(*(int *)(lVar8 + 0x18) == 0) | r_size;
    }
    else {
      uVar4 = (int)((ulong)((long)_Var6._M_current - lVar8) >> 5) - 1;
    }
    return uVar4;
  }
  solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>::rc_data[]>>>
            ();
}

Assistant:

int solve(int k, R& reduced_cost, int r_size)
    {
        const auto it_constraint = constraints.find(k);
        bx_expects(it_constraint != constraints.end());

        items.resize(r_size);
        for (int i = 0; i != r_size; ++i) {
            items[i].r = reduced_cost[i].value;
            items[i].variable = reduced_cost[i].id;
            items[i].factor = reduced_cost[i].f;
            items[i].result = 0;
        }

        Float z_best = 0;
        auto best = 0;
        auto start_solution = it_constraint->start;

        for (int j = 0; j != r_size; ++j)
            if (flat_constraints[start_solution + j])
                z_best += reduced_cost[j].value;

        for (auto i = 1; i != it_constraint->solutions; ++i) {
            start_solution = it_constraint->start + (i * r_size);

            Float z = 0;
            for (int j = 0; j != r_size; ++j)
                if (flat_constraints[start_solution + j])
                    z += reduced_cost[j].value;

            if (is_best_solution(z, z_best)) {
                z_best = z;
                best = i;
            }
        }

        start_solution = it_constraint->start + (best * r_size);
        for (int i = 0; i != r_size; ++i)
            items[i].result = flat_constraints[start_solution + i] ? 1 : 0;

        std::sort(std::begin(items),
                  std::end(items),
                  [](const auto& lhs, const auto& rhs) {
                      if (lhs.result == rhs.result) {
                          if constexpr (std::is_same_v<Mode, minimize_tag>)
                              return lhs.r < rhs.r;
                          else
                              return lhs.r > rhs.r;
                      } else
                          return lhs.result > rhs.result;
                  });

        auto middle =
          std::find_if(std::begin(items),
                       std::end(items),
                       [](const auto& item) { return item.result == 0; });

        for (std::size_t i = 0, e = items.size(); i != e; ++i) {
            reduced_cost[i].value = items[i].r;
            reduced_cost[i].id = items[i].variable;
            reduced_cost[i].f = items[i].factor;
        }

        if (middle == std::end(items))
            return items[0].result == 0 ? -1 : r_size;

        return static_cast<int>(std::distance(std::begin(items), middle) - 1);
    }